

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O3

int fitsInsideBoundaries(Point32 *coord32,TerritoryBoundary *b)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  
  uVar3 = 0;
  if ((b->miny <= coord32->latMicroDeg) && (coord32->latMicroDeg < b->maxy)) {
    iVar1 = coord32->lonMicroDeg;
    iVar2 = b->minx;
    uVar3 = 1;
    if (iVar1 < iVar2 || b->maxx <= iVar1) {
      iVar4 = iVar1 + 360000000;
      if (iVar2 <= iVar1) {
        iVar4 = iVar1 + -360000000;
      }
      uVar3 = (uint)(iVar4 < b->maxx && iVar2 <= iVar4);
    }
  }
  return uVar3;
}

Assistant:

static int fitsInsideBoundaries(const Point32 *coord32, const TerritoryBoundary *b) {
    ASSERT(coord32);
    ASSERT(b);
    return (b->miny <= coord32->latMicroDeg &&
            coord32->latMicroDeg < b->maxy &&
            isInRange(coord32->lonMicroDeg, b->minx, b->maxx));
}